

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall chatra::RuntimeImp::RuntimeImp(RuntimeImp *this,shared_ptr<chatra::IHost> *host)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __node_base_ptr *pp_Var2;
  __node_base_ptr *pp_Var3;
  long lVar4;
  __node_base_ptr *pp_Var5;
  __node_base_ptr *pp_Var6;
  long lVar7;
  
  (this->super_Runtime)._vptr_Runtime = (_func_int **)&PTR__RuntimeImp_00243578;
  (this->super_IErrorReceiver)._vptr_IErrorReceiver = (_func_int **)&DAT_002436b0;
  (this->super_IConcurrentGcConfiguration)._vptr_IConcurrentGcConfiguration =
       (_func_int **)&PTR__RuntimeImp_002436d8;
  (this->super_IDebugger)._vptr_IDebugger = (_func_int **)&PTR__RuntimeImp_00243710;
  (this->self).super___weak_ptr<chatra::RuntimeImp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->self).super___weak_ptr<chatra::RuntimeImp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  UNLOCK();
  lVar7 = lastRuntimeId + 1;
  this->runtimeId = lastRuntimeId;
  lastRuntimeId = lVar7;
  (this->host).super___shared_ptr<chatra::IHost,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (host->super___shared_ptr<chatra::IHost,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  lVar7 = 0;
  (this->host).super___shared_ptr<chatra::IHost,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (host->super___shared_ptr<chatra::IHost,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (host->super___shared_ptr<chatra::IHost,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->host).super___shared_ptr<chatra::IHost,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  (host->super___shared_ptr<chatra::IHost,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  this->multiThread = false;
  this->closed = false;
  this->parserErrorRaised = false;
  this->attemptToShutdown = (__atomic_base<bool>)0x0;
  (this->primarySTable).super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->primarySTable).super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lockSTable).flag.super___atomic_flag_base._M_i = false;
  (this->distributedSTable).super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->distributedSTable).super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->parserWs).generatedVarCount = 0;
  (this->storage).super___shared_ptr<chatra::Storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->storage).super___shared_ptr<chatra::Storage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->gcWaitCount).super___atomic_base<int>._M_i = 0;
  (this->mtGc).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mtGc).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mtGc).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mtGc).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mtGc).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->gcInstance)._M_t.
  super___uniq_ptr_impl<chatra::Instance,_std::default_delete<chatra::Instance>_>._M_t.
  super__Tuple_impl<0UL,_chatra::Instance_*,_std::default_delete<chatra::Instance>_>.
  super__Head_base<0UL,_chatra::Instance_*,_false>._M_head_impl = (Instance *)0x0;
  *(undefined8 *)
   ((long)&(this->gcInstance)._M_t.
           super___uniq_ptr_impl<chatra::Instance,_std::default_delete<chatra::Instance>_>._M_t.
           super__Tuple_impl<0UL,_chatra::Instance_*,_std::default_delete<chatra::Instance>_>.
           super__Head_base<0UL,_chatra::Instance_*,_false>._M_head_impl + 1) = 0;
  *(undefined8 *)
   ((long)&(this->gcThread)._M_t.
           super___uniq_ptr_impl<chatra::Thread,_std::default_delete<chatra::Thread>_>._M_t.
           super__Tuple_impl<0UL,_chatra::Thread_*,_std::default_delete<chatra::Thread>_>.
           super__Head_base<0UL,_chatra::Thread_*,_false>._M_head_impl + 1) = 0;
  (this->packageIds).values._M_h._M_buckets = &(this->packageIds).values._M_h._M_single_bucket;
  (this->packageIds).values._M_h._M_bucket_count = 1;
  (this->packageIds).values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->packageIds).values._M_h._M_element_count = 0;
  (this->packageIds).values._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->packageIds).values._M_h._M_rehash_policy._M_next_resize = 0;
  (this->packageIds).values._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->packageIds).recycledIds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->packageIds).recycledIds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->packageIds).recycledIds.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->packageIds).recycledIds.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->instanceIds).values._M_h._M_buckets = &(this->instanceIds).values._M_h._M_single_bucket;
  (this->instanceIds).values._M_h._M_bucket_count = 1;
  (this->instanceIds).values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->instanceIds).values._M_h._M_element_count = 0;
  (this->instanceIds).values._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->instanceIds).values._M_h._M_rehash_policy._M_next_resize = 0;
  (this->instanceIds).values._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->instanceIds).recycledIds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->instanceIds).recycledIds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->instanceIds).recycledIds.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->instanceIds).recycledIds.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->threadIds).values._M_h._M_buckets = &(this->threadIds).values._M_h._M_single_bucket;
  (this->threadIds).values._M_h._M_bucket_count = 1;
  (this->threadIds).values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->threadIds).values._M_h._M_element_count = 0;
  (this->threadIds).values._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->threadIds).values._M_h._M_rehash_policy._M_next_resize = 0;
  (this->threadIds).values._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->threadIds).recycledIds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threadIds).recycledIds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->threadIds).recycledIds.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->threadIds).recycledIds.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined8 *)((long)&(this->mtLoadPackage).super___mutex_base._M_mutex.__data.__list.__prev + 1)
       = 0;
  *(undefined8 *)((long)&(this->mtLoadPackage).super___mutex_base._M_mutex.__data.__list.__next + 1)
       = 0;
  *(undefined8 *)((long)&(this->mtLoadPackage).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mtLoadPackage).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mtLoadPackage).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mtLoadPackage).super___mutex_base._M_mutex + 8) = 0;
  (this->recycledRefs).super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->recycledRefs).super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scope)._M_t.super___uniq_ptr_impl<chatra::Scope,_std::default_delete<chatra::Scope>_>._M_t.
  super__Tuple_impl<0UL,_chatra::Scope_*,_std::default_delete<chatra::Scope>_>.
  super__Head_base<0UL,_chatra::Scope_*,_false>._M_head_impl = (Scope *)0x0;
  (this->recycledRefs).super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->packages)._M_h._M_buckets = &(this->packages)._M_h._M_single_bucket;
  (this->packages)._M_h._M_bucket_count = 1;
  (this->packages)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->packages)._M_h._M_element_count = 0;
  (this->packages)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->packages)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->packages)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->packageIdByName)._M_h._M_buckets = &(this->packageIdByName)._M_h._M_single_bucket;
  (this->packageIdByName)._M_h._M_bucket_count = 1;
  (this->packageIdByName)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->packageIdByName)._M_h._M_element_count = 0;
  (this->packageIdByName)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->classes).classes.super__Fwd_list_base<chatra::Class,_std::allocator<chatra::Class>_>.
  _M_impl._M_head._M_next = (_Fwd_list_node_base *)0x0;
  (this->packageIdByName)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->packageIdByName)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->classes).byName._M_h._M_buckets = &(this->classes).byName._M_h._M_single_bucket;
  (this->classes).byName._M_h._M_bucket_count = 1;
  (this->classes).byName._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->classes).byName._M_h._M_element_count = 0;
  (this->classes).byName._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->classes).byName._M_h._M_rehash_policy._M_next_resize = 0;
  (this->classes).byName._M_h._M_single_bucket = (__node_base_ptr)0x0;
  MethodTable::MethodTable(&this->methods);
  pp_Var2 = &(this->operators).super_AsyncReadWrite<chatra::OperatorTable>.
             super_AsyncRead<chatra::OperatorTable>.values[0].byOp1[0]._M_h._M_single_bucket;
  pp_Var3 = &(this->operators).super_AsyncReadWrite<chatra::OperatorTable>.
             super_AsyncRead<chatra::OperatorTable>.values[0].byOp2[0]._M_h._M_single_bucket;
  do {
    *(undefined8 *)
     ((long)(this->operators).super_AsyncReadWrite<chatra::OperatorTable>.
            super_AsyncRead<chatra::OperatorTable>.values[0].byOp1 + lVar7 + -8) = 0;
    lVar4 = 0xf50;
    pp_Var5 = pp_Var2;
    do {
      ((_Hashtable *)(pp_Var5 + -6))->_M_buckets = pp_Var5;
      pp_Var5[-5] = (__node_base_ptr)0x1;
      ((__node_base *)(pp_Var5 + -4))->_M_nxt = (_Hash_node_base *)0x0;
      pp_Var5[-3] = (__node_base_ptr)0x0;
      ((_Prime_rehash_policy *)(pp_Var5 + -2))->_M_max_load_factor = 1.0;
      pp_Var5[-1] = (__node_base_ptr)0x0;
      *pp_Var5 = (__node_base_ptr)0x0;
      pp_Var5 = pp_Var5 + 7;
      lVar4 = lVar4 + -0x38;
    } while (lVar4 != 0);
    lVar4 = 0x1180;
    pp_Var6 = pp_Var3;
    do {
      pp_Var6[-6] = (__node_base_ptr)pp_Var6;
      pp_Var6[-5] = (__node_base_ptr)0x1;
      ((__node_base *)(pp_Var6 + -4))->_M_nxt = (_Hash_node_base *)0x0;
      pp_Var6[-3] = (__node_base_ptr)0x0;
      ((_Prime_rehash_policy *)(pp_Var6 + -2))->_M_max_load_factor = 1.0;
      pp_Var6[-1] = (__node_base_ptr)0x0;
      *pp_Var6 = (__node_base_ptr)0x0;
      pp_Var6 = pp_Var6 + 8;
      lVar4 = lVar4 + -0x40;
    } while (lVar4 != 0);
    lVar7 = lVar7 + 0x20d8;
    pp_Var2 = pp_Var2 + 0x41b;
    pp_Var3 = pp_Var3 + 0x41b;
  } while (lVar7 != 0x41b0);
  (this->operators).super_AsyncReadWrite<chatra::OperatorTable>.
  super_AsyncRead<chatra::OperatorTable>.index = 0;
  (this->operators).super_AsyncReadWrite<chatra::OperatorTable>.
  super_AsyncRead<chatra::OperatorTable>.valueForRead._M_b._M_p = (__pointer_type)&this->operators;
  (this->operators).super_AsyncReadWrite<chatra::OperatorTable>.
  super_AsyncRead<chatra::OperatorTable>.readCount.super___atomic_base<int>._M_i = 0;
  (this->operators).super_AsyncReadWrite<chatra::OperatorTable>.
  super_AsyncRead<chatra::OperatorTable>.field_0x41c4 = 0;
  (this->operators).methods.
  super__Fwd_list_base<chatra::OperatorMethod,_std::allocator<chatra::OperatorMethod>_>._M_impl.
  _M_head._M_next = (_Fwd_list_node_base *)0x0;
  (this->queue).super__Deque_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->queue).super__Deque_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->queue).super__Deque_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->queue).super__Deque_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->queue).super__Deque_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->queue).super__Deque_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->queue).super__Deque_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->queue).super__Deque_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->queue).super__Deque_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->queue).super__Deque_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>::_M_initialize_map
            (&(this->queue).super__Deque_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>,0
            );
  (this->lockQueue).flag.super___atomic_flag_base._M_i = false;
  (this->mtQueue).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mtQueue).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mtQueue).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mtQueue).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mtQueue).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->cvQueue);
  std::condition_variable::condition_variable(&this->cvShutdown);
  this->targetWorkerThreads = 0;
  this->nextId = 0;
  (this->workerThreads)._M_h._M_buckets = &(this->workerThreads)._M_h._M_single_bucket;
  (this->workerThreads)._M_h._M_bucket_count = 1;
  (this->workerThreads)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->workerThreads)._M_h._M_element_count = 0;
  (this->workerThreads)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->workerThreads)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->workerThreads)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->hasWaitingThreads = (__atomic_base<bool>)0x0;
  this->lockWaitingThreads = (atomic_flag)0x0;
  (this->waitingThreads)._M_h._M_buckets = &(this->waitingThreads)._M_h._M_single_bucket;
  (this->waitingThreads)._M_h._M_bucket_count = 1;
  (this->waitingThreads)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->waitingThreads)._M_h._M_element_count = 0;
  (this->waitingThreads)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->waitingThreads)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->waitingThreads)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->recycledWaitingIds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->recycledWaitingIds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->recycledWaitingIds).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->recycledWaitingIds).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->timers)._M_h._M_buckets = &(this->timers)._M_h._M_single_bucket;
  (this->timers)._M_h._M_bucket_count = 1;
  (this->timers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->timers)._M_h._M_element_count = 0;
  (this->timers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->idToTimer).super__Vector_base<chatra::Timer_*,_std::allocator<chatra::Timer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->idToTimer).super__Vector_base<chatra::Timer_*,_std::allocator<chatra::Timer_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->idToTimer).super__Vector_base<chatra::Timer_*,_std::allocator<chatra::Timer_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->timers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->timers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sleepRequests)._M_h._M_buckets = &(this->sleepRequests)._M_h._M_single_bucket;
  (this->sleepRequests)._M_h._M_bucket_count = 1;
  (this->sleepRequests)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sleepRequests)._M_h._M_element_count = 0;
  (this->sleepRequests)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sleepRequests)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sleepRequests)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->sleepRequests)._M_h._M_single_bucket + 1) = 0;
  *(undefined8 *)((long)&this->finalizerThread + 1) = 0;
  (this->methodTableCache).cache._M_h._M_buckets =
       &(this->methodTableCache).cache._M_h._M_single_bucket;
  (this->methodTableCache).cache._M_h._M_bucket_count = 1;
  (this->methodTableCache).cache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->methodTableCache).cache._M_h._M_element_count = 0;
  (this->methodTableCache).cache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->methodTableCache).cache._M_h._M_rehash_policy._M_next_resize = 0;
  (this->methodTableCache).cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->lockDrivers).flag.super___atomic_flag_base._M_i = false;
  (this->drivers)._M_h._M_buckets = &(this->drivers)._M_h._M_single_bucket;
  (this->drivers)._M_h._M_bucket_count = 1;
  (this->drivers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->drivers)._M_h._M_element_count = 0;
  (this->drivers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->previousWorkerThreads = 0;
  *(undefined8 *)((long)&(this->lockDebugger).super___mutex_base._M_mutex.__data.__list.__prev + 1)
       = 0;
  *(undefined8 *)((long)&(this->lockDebugger).super___mutex_base._M_mutex.__data.__list.__next + 1)
       = 0;
  *(undefined8 *)((long)&(this->lockDebugger).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lockDebugger).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->lockDebugger).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lockDebugger).super___mutex_base._M_mutex + 8) = 0;
  (this->debuggerHost).
  super___shared_ptr<chatra::debugger::IDebuggerHost,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->debuggerHost).
  super___shared_ptr<chatra::debugger::IDebuggerHost,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->drivers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->drivers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->breakPoints)._M_h._M_buckets = &(this->breakPoints)._M_h._M_single_bucket;
  (this->breakPoints)._M_h._M_bucket_count = 1;
  (this->breakPoints)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->breakPoints)._M_h._M_element_count = 0;
  (this->breakPoints)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->trashNodes).
  super__Fwd_list_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl._M_head._M_next = (_Fwd_list_node_base *)0x0;
  *(undefined8 *)((long)&(this->breakPoints)._M_h._M_single_bucket + 1) = 0;
  *(undefined8 *)((long)&this->nextBreakPointId + 1) = 0;
  (this->breakPoints)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->breakPoints)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

RuntimeImp::RuntimeImp(std::shared_ptr<IHost> host) noexcept
		: runtimeId(static_cast<RuntimeId>(lastRuntimeId.fetch_add(1))),
		host(std::move(host)), methods(MethodTable::ForEmbeddedMethods()) {
}